

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_set_xo_var(secp256k1_ge *r,secp256k1_fe *x,int odd)

{
  uint64_t uVar1;
  int iVar2;
  
  iVar2 = secp256k1_ge_set_xquad(r,x);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    secp256k1_fe_normalize_var(&r->y);
    uVar1 = (r->y).n[0];
    iVar2 = 1;
    if (((uint)uVar1 & 1) != odd) {
      (r->y).n[0] = 0x3ffffbfffff0bc - uVar1;
      (r->y).n[1] = 0x3ffffffffffffc - (r->y).n[1];
      (r->y).n[2] = 0x3ffffffffffffc - (r->y).n[2];
      (r->y).n[3] = 0x3ffffffffffffc - (r->y).n[3];
      (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_ge_set_xo_var(secp256k1_ge *r, const secp256k1_fe *x, int odd) {
    if (!secp256k1_ge_set_xquad(r, x)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&r->y);
    if (secp256k1_fe_is_odd(&r->y) != odd) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
    }
    return 1;

}